

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_edge_offset_class0
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  byte *in_RDI;
  undefined1 *in_R8;
  char *in_stack_00000010;
  WORD32 edge_idx;
  WORD32 bit_depth;
  WORD8 u1_sign_right;
  WORD8 u1_sign_left;
  UWORD8 au1_src_left_tmp [64];
  UWORD8 au1_mask [64];
  WORD32 col;
  WORD32 row;
  byte local_d0;
  char local_b9;
  byte abStack_b8 [64];
  byte local_78 [64];
  int local_38;
  int local_34;
  undefined1 *local_28;
  long local_20;
  long local_18;
  int local_c;
  byte *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_78,0xff,0x40);
  *local_28 = *(undefined1 *)(local_20 + (au1_src_left_tmp._0_4_ + -1));
  for (local_34 = 0; local_34 < (int)au1_src_left_tmp._8_4_; local_34 = local_34 + 1) {
    abStack_b8[local_34] = local_8[local_34 * local_c + au1_src_left_tmp._0_4_ + -1];
  }
  for (local_38 = 0; local_38 < (int)au1_src_left_tmp._0_4_; local_38 = local_38 + 1) {
    *(byte *)(local_20 + local_38) = local_8[(au1_src_left_tmp._8_4_ + -1) * local_c + local_38];
  }
  if (*in_stack_00000010 == '\0') {
    local_78[0] = 0;
  }
  if (in_stack_00000010[1] == '\0') {
    local_78[au1_src_left_tmp._0_4_ + -1] = 0;
  }
  for (local_34 = 0; local_34 < (int)au1_src_left_tmp._8_4_; local_34 = local_34 + 1) {
    if ((int)((uint)*local_8 - (uint)*(byte *)(local_18 + local_34)) < 0) {
      local_b9 = -1;
    }
    else {
      local_b9 = 0 < (int)((uint)*local_8 - (uint)*(byte *)(local_18 + local_34));
    }
    for (local_38 = 0; local_38 < (int)au1_src_left_tmp._0_4_; local_38 = local_38 + 1) {
      if ((int)((uint)local_8[local_38] - (uint)local_8[local_38 + 1]) < 0) {
        cVar1 = -1;
      }
      else {
        cVar1 = 0 < (int)((uint)local_8[local_38] - (uint)local_8[local_38 + 1]);
      }
      iVar2 = (int)local_b9;
      local_b9 = -cVar1;
      uVar3 = gi4_ihevc_table_edge_idx[iVar2 + 2 + (int)cVar1] & (uint)local_78[local_38];
      if (uVar3 != 0) {
        if ((int)((uint)local_8[local_38] + (int)*(char *)(_bit_depth + (int)uVar3)) < 0x100) {
          if ((int)((uint)local_8[local_38] + (int)*(char *)(_bit_depth + (int)uVar3)) < 0) {
            local_d0 = 0;
          }
          else {
            local_d0 = local_8[local_38] + *(char *)(_bit_depth + (int)uVar3);
          }
        }
        else {
          local_d0 = 0xff;
        }
        local_8[local_38] = local_d0;
      }
    }
    local_8 = local_8 + local_c;
  }
  for (local_34 = 0; local_34 < (int)au1_src_left_tmp._8_4_; local_34 = local_34 + 1) {
    *(byte *)(local_18 + local_34) = abStack_b8[local_34];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class0(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    WORD8 u1_sign_left, u1_sign_right;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);
    bit_depth = BIT_DEPTH_LUMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update top and top-left arrays */
    *pu1_src_top_left = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update masks based on the availability flags */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            u1_sign_left = SIGN(pu1_src[0] - pu1_src_left[row]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_right = SIGN(pu1_src[col] - pu1_src[col + 1]);
                edge_idx = 2 + u1_sign_left + u1_sign_right;
                u1_sign_left = -u1_sign_right;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    /* Update left array */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }

}